

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

string * __thiscall Json::OurReader::getFormattedErrorMessages_abi_cxx11_(OurReader *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  _Self *in_RDI;
  ErrorInfo *error;
  const_iterator itError;
  string *formattedMessage;
  _Self *__x;
  string local_170 [32];
  string local_150 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  string local_130 [32];
  Location in_stack_fffffffffffffef0;
  OurReader *in_stack_fffffffffffffef8;
  string local_f0 [48];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  reference local_60;
  _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
  local_38;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
             in_RDI);
  while( true ) {
    std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
              ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
               in_RDI);
    bVar1 = std::operator!=(__x,in_RDI);
    if (!bVar1) break;
    local_60 = std::
               _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
               ::operator*(&local_38);
    getLocationLineAndColumn_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::operator+((char *)in_RSI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
    std::operator+(in_RSI,(char *)__x);
    std::__cxx11::string::operator+=((string *)in_RDI,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::operator+(in_RSI,(char *)__x);
    std::__cxx11::string::operator+=((string *)in_RDI,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    if (local_60->extra_ != (Location)0x0) {
      getLocationLineAndColumn_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::operator+((char *)in_RSI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
      std::operator+(in_RSI,(char *)__x);
      std::__cxx11::string::operator+=((string *)in_RDI,local_130);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
    }
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++(__x);
  }
  return (string *)__x;
}

Assistant:

std::string OurReader::getFormattedErrorMessages() const {
  std::string formattedMessage;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}